

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void die_follower(CHAR_DATA *ch)

{
  bool bVar1;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var2;
  CHAR_DATA *fch;
  CHAR_DATA *fch_next;
  bool in_stack_000000bf;
  CHAR_DATA *in_stack_000000c0;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  CHAR_DATA *ch_01;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  CHAR_DATA *in_stack_fffffffffffffff0;
  
  if (in_RDI == (CHAR_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffff0,
               (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    CLogger::Debug<>((CLogger *)fch,_fch_next);
  }
  else {
    if (in_RDI->master != (CHAR_DATA *)0x0) {
      if (in_RDI->master->pet == in_RDI) {
        in_RDI->master->pet = (CHAR_DATA *)0x0;
      }
      stop_follower(in_stack_ffffffffffffffe0);
    }
    in_RDI->leader = (CHAR_DATA *)0x0;
    ch_01 = char_list;
    while (ch_00 = ch_01, ch_00 != (CHAR_DATA *)0x0) {
      ch_01 = ch_00->next;
      bVar1 = is_npc(ch_00);
      if ((bVar1) &&
         ((bVar1 = is_affected(ch_00,(int)gsn_animate_dead), bVar1 ||
          (bVar1 = is_affected_by((CHAR_DATA *)
                                  CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                                  (int)((ulong)ch_01 >> 0x20)), bVar1)))) {
        if (ch_00->master == in_RDI) {
          _Var2 = std::pow<int,int>(0,0x52ad6c);
          ch_00->affected_by[0] = ((long)_Var2 ^ 0xffffffffffffffffU) & ch_00->affected_by[0];
          affect_strip(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
          act((char *)in_stack_fffffffffffffff0,
              (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),ch_01,ch_00
              ,0);
          extract_char(in_stack_000000c0,in_stack_000000bf);
        }
      }
      else {
        if ((ch_00->master == in_RDI) && (bVar1 = is_affected(ch_00,(int)gsn_trail), !bVar1)) {
          stop_follower(ch_01);
        }
        if ((ch_00->leader == in_RDI) && (bVar1 = is_affected(ch_00,(int)gsn_trail), !bVar1)) {
          ch_00->leader = ch_00;
        }
      }
    }
  }
  return;
}

Assistant:

void die_follower(CHAR_DATA *ch)
{
	if (!ch)
	{
		RS.Logger.Debug("Error: Die follower, invalid master.");
		return;
	}

	if (ch->master != nullptr)
	{
		if (ch->master->pet == ch)
			ch->master->pet = nullptr;

		stop_follower(ch);
	}

	ch->leader = nullptr;

	CHAR_DATA *fch_next;
	for (auto fch = char_list; fch != nullptr; fch = fch_next)
	{
		fch_next = fch->next;
		/*if(!fch->in_room && is_npc(fch))
		{
			RS.Logger.Debug("Error: Mob {} in room is nullptr!",fch->pIndexData->vnum);
			break;
		}*/
		if (is_npc(fch) && (is_affected(fch, gsn_animate_dead) || is_affected_by(fch, AFF_CHARM)))
		{
			if (fch->master == ch)
			{
				REMOVE_BIT(fch->affected_by, AFF_CHARM);
				affect_strip(fch, gsn_animate_dead);
				act("$n slowly fades away.", fch, nullptr, nullptr, TO_ROOM);
				extract_char(fch, true);
			}
		}
		else
		{
			if (fch->master == ch && !is_affected(fch, gsn_trail))
				stop_follower(fch);

			if (fch->leader == ch && !is_affected(fch, gsn_trail))
				fch->leader = fch;
		}
	}
}